

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3Rehash(Fts3Hash *pH,int new_size)

{
  Fts3HashElem *pFVar1;
  uint uVar2;
  int iVar3;
  _fts3ht *p_Var4;
  Fts3HashElem *pNew;
  code *pcVar5;
  
  p_Var4 = (_fts3ht *)fts3HashMalloc((long)new_size << 4);
  if (p_Var4 == (_fts3ht *)0x0) {
    iVar3 = 1;
  }
  else {
    sqlite3_free(pH->ht);
    pH->ht = p_Var4;
    pH->htsize = new_size;
    pcVar5 = fts3BinHash;
    if (pH->keyClass == '\x01') {
      pcVar5 = fts3StrHash;
    }
    pNew = pH->first;
    pH->first = (Fts3HashElem *)0x0;
    while (pNew != (Fts3HashElem *)0x0) {
      uVar2 = (*pcVar5)(pNew->pKey,pNew->nKey);
      pFVar1 = pNew->next;
      fts3HashInsertElement(pH,p_Var4 + (int)(uVar2 & new_size - 1U),pNew);
      pNew = pFVar1;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int fts3Rehash(Fts3Hash *pH, int new_size){
  struct _fts3ht *new_ht;          /* The new hash table */
  Fts3HashElem *elem, *next_elem;  /* For looping over existing elements */
  int (*xHash)(const void*,int);   /* The hash function */

  assert( (new_size & (new_size-1))==0 );
  new_ht = (struct _fts3ht *)fts3HashMalloc( new_size*sizeof(struct _fts3ht) );
  if( new_ht==0 ) return 1;
  fts3HashFree(pH->ht);
  pH->ht = new_ht;
  pH->htsize = new_size;
  xHash = ftsHashFunction(pH->keyClass);
  for(elem=pH->first, pH->first=0; elem; elem = next_elem){
    int h = (*xHash)(elem->pKey, elem->nKey) & (new_size-1);
    next_elem = elem->next;
    fts3HashInsertElement(pH, &new_ht[h], elem);
  }
  return 0;
}